

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_6;
  DelayedSequenceElementSyntax *pDVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor;
  SyntaxNode *local_60;
  Token local_58;
  Token local_48;
  DeepCloneVisitor visitor_1;
  SyntaxNode *local_28;
  
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x28) == (SyntaxNode *)0x0) {
    local_60 = (SyntaxNode *)0x0;
  }
  else {
    local_60 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x28),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x50) == (SyntaxNode *)0x0) {
    local_28 = (SyntaxNode *)0x0;
  }
  else {
    local_28 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x50),&visitor_1,(BumpAllocator *)__child_stack);
  }
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  args_6 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x68),&visitor_2,(BumpAllocator *)__child_stack);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DelayedSequenceElementSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::parsing::Token,slang::syntax::SelectorSyntax*,slang::parsing::Token,slang::syntax::SequenceExprSyntax&>
                     ((BumpAllocator *)__child_stack,&local_48,(ExpressionSyntax **)&local_60,
                      (Token *)&visitor,&local_58,(SelectorSyntax **)&local_28,(Token *)&visitor_1,
                      (SequenceExprSyntax *)args_6);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DelayedSequenceElementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DelayedSequenceElementSyntax>(
        node.doubleHash.deepClone(alloc),
        node.delayVal ? deepClone(*node.delayVal, alloc) : nullptr,
        node.openBracket.deepClone(alloc),
        node.op.deepClone(alloc),
        node.range ? deepClone(*node.range, alloc) : nullptr,
        node.closeBracket.deepClone(alloc),
        *deepClone<SequenceExprSyntax>(*node.expr, alloc)
    );
}